

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

Vec_Int_t * Gla_ManRefinement(Gla_Man_t *p)

{
  Gia_Man_t *p_00;
  uint *puVar1;
  int iVar2;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pAVar3;
  int i;
  Vec_Int_t *vMap;
  Abc_Cex_t *pCex;
  
  Gia_GlaPrepareCexAndMap(p,&pCex,&vMap);
  p_01 = Rnm_ManRefine(p->pRnm,pCex,vMap,p->pPars->fPropFanout,p->pPars->fNewRefine,1);
  Abc_CexFree(pCex);
  if (p_01->nSize == 0) {
    Vec_IntFree(p_01);
    Abc_CexFreeP(&p->pGia->pCexSeq);
    pAVar3 = Gla_ManDeriveCex(p,vMap);
    p->pGia->pCexSeq = pAVar3;
    Vec_IntFree(vMap);
    p_01 = (Vec_Int_t *)0x0;
  }
  else {
    Vec_IntFree(vMap);
    for (i = 0; iVar2 = p_01->nSize, i < iVar2; i = i + 1) {
      p_00 = p->pGia;
      iVar2 = Vec_IntEntry(p_01,i);
      pObj = Gia_ManObj(p_00,iVar2);
      if (pObj == (Gia_Obj_t *)0x0) {
        iVar2 = p_01->nSize;
        break;
      }
      puVar1 = p->pObj2Obj;
      iVar2 = Gia_ObjId(p->pGia,pObj);
      Vec_IntWriteEntry(p_01,i,puVar1[iVar2]);
    }
    p->nObjAdded = p->nObjAdded + iVar2;
  }
  return p_01;
}

Assistant:

Vec_Int_t * Gla_ManRefinement( Gla_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap, * vVec;
    Gia_Obj_t * pObj;
    int i;
    Gia_GlaPrepareCexAndMap( p, &pCex, &vMap );
    vVec = Rnm_ManRefine( p->pRnm, pCex, vMap, p->pPars->fPropFanout, p->pPars->fNewRefine, 1 );
    Abc_CexFree( pCex );
    if ( Vec_IntSize(vVec) == 0 )
    {
        Vec_IntFree( vVec );
        Abc_CexFreeP( &p->pGia->pCexSeq );
        p->pGia->pCexSeq = Gla_ManDeriveCex( p, vMap );
        Vec_IntFree( vMap );
        return NULL;
    }
    Vec_IntFree( vMap );
    // remap them into GLA objects
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        Vec_IntWriteEntry( vVec, i, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] );
    p->nObjAdded += Vec_IntSize(vVec);
    return vVec;
}